

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
           *this)

{
  tuple<unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  *this_00;
  char *pcVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined8 uVar24;
  ctrl_t *pcVar25;
  size_t sVar26;
  ulong uVar27;
  slot_type *psVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  byte bVar30;
  Person *pPVar31;
  ulong uVar32;
  size_t i;
  FindInfo FVar33;
  Person PStack_78;
  
  uVar5 = this->capacity_;
  if (uVar5 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar5 + 1 & uVar5) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x248,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar5 - (uVar5 >> 3) >> 1 < this->size_) {
    resize(this,uVar5 * 2 + 1);
    return;
  }
  uVar5 = this->capacity_;
  if ((uVar5 == 0) || ((uVar5 + 1 & uVar5) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                 );
  }
  if (uVar5 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                 );
  }
  pcVar6 = this->ctrl_;
  if (pcVar6[uVar5] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar25 = pcVar6 + uVar5;
  if (pcVar25 + 1 != pcVar6) {
    uVar32 = 0;
    do {
      pcVar1 = pcVar6 + uVar32;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar6 + uVar32);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      uVar32 = uVar32 + 0x10;
    } while (uVar5 + 1 != uVar32);
  }
  uVar24 = *(undefined8 *)(pcVar6 + 8);
  *(undefined8 *)(pcVar25 + 1) = *(undefined8 *)pcVar6;
  *(undefined8 *)(pcVar25 + 9) = uVar24;
  *pcVar25 = -1;
  sVar26 = this->capacity_;
  if (sVar26 != 0) {
    this_00 = &this->settings_;
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar26 = hash_value(this->slots_ + i);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = sVar26;
        uVar32 = SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar33 = find_first_non_full(this,uVar32);
        sVar26 = FVar33.offset;
        uVar5 = this->capacity_;
        if ((uVar5 + 1 & uVar5) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar27 = uVar32 >> 7 & uVar5;
        bVar30 = (byte)uVar32;
        if (((i - uVar27 ^ sVar26 - uVar27) & uVar5) < 0x10) {
          bVar30 = bVar30 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar26] == -2) {
            set_ctrl(this,sVar26,bVar30 & 0x7f);
            psVar7 = this->slots_;
            __gnu_cxx::new_allocator<Person>::construct<Person,Person>
                      ((new_allocator<Person> *)this_00,&PStack_78,psVar7 + i);
            __gnu_cxx::new_allocator<Person>::destroy<Person>
                      ((new_allocator<Person> *)this_00,psVar7 + i);
            pPVar31 = this->slots_ + sVar26;
            __gnu_cxx::new_allocator<Person>::construct<Person,Person>
                      ((new_allocator<Person> *)this_00,this->slots_ + i,pPVar31);
            __gnu_cxx::new_allocator<Person>::destroy<Person>
                      ((new_allocator<Person> *)this_00,pPVar31);
            psVar7 = this->slots_ + sVar26;
            psVar28 = this->slots_ + sVar26;
            paVar29 = &(psVar28->_first).field_2;
            (psVar28->_first)._M_dataplus._M_p = (pointer)paVar29;
            paVar3 = &PStack_78._first.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)PStack_78._first._M_dataplus._M_p == paVar3) {
              paVar29->_M_allocated_capacity =
                   CONCAT71(PStack_78._first.field_2._M_allocated_capacity._1_7_,
                            PStack_78._first.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&(psVar28->_first).field_2 + 8) = PStack_78._first.field_2._8_8_
              ;
            }
            else {
              (psVar7->_first)._M_dataplus._M_p = PStack_78._first._M_dataplus._M_p;
              (psVar7->_first).field_2._M_allocated_capacity =
                   CONCAT71(PStack_78._first.field_2._M_allocated_capacity._1_7_,
                            PStack_78._first.field_2._M_local_buf[0]);
            }
            (psVar7->_first)._M_string_length = PStack_78._first._M_string_length;
            PStack_78._first._M_string_length = 0;
            PStack_78._first.field_2._M_local_buf[0] = '\0';
            paVar29 = &(psVar7->_last).field_2;
            (psVar7->_last)._M_dataplus._M_p = (pointer)paVar29;
            paVar4 = &PStack_78._last.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)PStack_78._last._M_dataplus._M_p == paVar4) {
              paVar29->_M_allocated_capacity =
                   CONCAT71(PStack_78._last.field_2._M_allocated_capacity._1_7_,
                            PStack_78._last.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&(psVar7->_last).field_2 + 8) = PStack_78._last.field_2._8_8_;
            }
            else {
              (psVar7->_last)._M_dataplus._M_p = PStack_78._last._M_dataplus._M_p;
              (psVar7->_last).field_2._M_allocated_capacity =
                   CONCAT71(PStack_78._last.field_2._M_allocated_capacity._1_7_,
                            PStack_78._last.field_2._M_local_buf[0]);
            }
            (psVar7->_last)._M_string_length = PStack_78._last._M_string_length;
            PStack_78._last._M_string_length = 0;
            PStack_78._last.field_2._M_local_buf[0] = '\0';
            psVar7->_age = PStack_78._age;
            PStack_78._first._M_dataplus._M_p = (pointer)paVar3;
            PStack_78._last._M_dataplus._M_p = (pointer)paVar4;
            __gnu_cxx::new_allocator<Person>::destroy<Person>
                      ((new_allocator<Person> *)this_00,&PStack_78);
            i = i - 1;
            goto LAB_0010225e;
          }
          if (this->ctrl_[sVar26] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                         );
          }
          set_ctrl(this,sVar26,bVar30 & 0x7f);
          pPVar31 = this->slots_ + i;
          __gnu_cxx::new_allocator<Person>::construct<Person,Person>
                    ((new_allocator<Person> *)this_00,this->slots_ + sVar26,pPVar31);
          __gnu_cxx::new_allocator<Person>::destroy<Person>
                    ((new_allocator<Person> *)this_00,pPVar31);
          bVar30 = 0x80;
        }
        set_ctrl(this,i,bVar30);
      }
LAB_0010225e:
      i = i + 1;
      sVar26 = this->capacity_;
    } while (i != sVar26);
  }
  reset_growth_left(this,sVar26);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }